

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O1

int WebPRescalerExport(WebPRescaler *rescaler)

{
  int iVar1;
  
  iVar1 = 0;
  if (rescaler->dst_y < rescaler->dst_height) {
    iVar1 = 0;
    do {
      if (0 < rescaler->y_accum) {
        return iVar1;
      }
      WebPRescalerExportRow(rescaler);
      iVar1 = iVar1 + 1;
    } while (rescaler->dst_y < rescaler->dst_height);
  }
  return iVar1;
}

Assistant:

int WebPRescalerExport(WebPRescaler* const rescaler) {
  int total_exported = 0;
  while (WebPRescalerHasPendingOutput(rescaler)) {
    WebPRescalerExportRow(rescaler);
    ++total_exported;
  }
  return total_exported;
}